

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_4,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_4> *in_RCX;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  Vec4 *local_e0;
  ulong local_d8;
  float local_d0 [6];
  float local_b8 [4];
  float local_a8 [6];
  float local_90 [3];
  float local_84 [3];
  Vector<float,_4> local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Matrix<float,_4,_4> local_50;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_68 = (evalCtx->coords).m_data[0];
    fStack_64 = (evalCtx->coords).m_data[1];
    fStack_60 = (evalCtx->coords).m_data[2];
    fStack_5c = (evalCtx->coords).m_data[3];
  }
  else {
    local_68 = (float)0x3fb33333;
    fStack_64 = (float)0x3e4ccccd;
    fStack_60 = (float)0xbf000000;
    fStack_5c = (float)0x3f333333;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_78.m_data[0] = (evalCtx->coords).m_data[0];
    local_78.m_data[1] = (evalCtx->coords).m_data[1];
    local_78.m_data[2] = (evalCtx->coords).m_data[2];
    local_78.m_data[3] = (evalCtx->coords).m_data[3];
  }
  else {
    local_78.m_data[0] = (float)0x3e4ccccd;
    local_78.m_data[1] = (float)0xbf800000;
    local_78.m_data[2] = (float)0x3f000000;
    local_78.m_data[3] = (float)0x3f4ccccd;
  }
  outerProduct<float,4,4>(&local_50,(MatrixCaseUtils *)&local_68,&local_78,in_RCX);
  local_84[0] = local_50.m_data.m_data[0].m_data[0];
  local_84[1] = local_50.m_data.m_data[0].m_data[1];
  local_84[2] = local_50.m_data.m_data[0].m_data[2];
  local_90[0] = local_50.m_data.m_data[1].m_data[1];
  local_90[1] = local_50.m_data.m_data[1].m_data[2];
  local_90[2] = local_50.m_data.m_data[1].m_data[3];
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  lVar1 = 0;
  do {
    local_b8[lVar1] = local_a8[lVar1 + 9] + local_a8[lVar1 + 6];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_a8[3] = local_50.m_data.m_data[2].m_data[2];
  local_a8[4] = local_50.m_data.m_data[2].m_data[3];
  local_a8[5] = local_50.m_data.m_data[2].m_data[0];
  local_e0 = (Vec4 *)0x0;
  local_d8 = local_d8 & 0xffffffff00000000;
  lVar1 = 0;
  do {
    *(float *)((long)&local_e0 + lVar1 * 4) = local_b8[lVar1] + local_a8[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_a8[0] = local_50.m_data.m_data[3].m_data[3];
  local_a8[1] = local_50.m_data.m_data[3].m_data[0];
  local_a8[2] = local_50.m_data.m_data[3].m_data[1];
  local_d0[2] = 0.0;
  local_d0[3] = 0.0;
  local_d0[4] = 0.0;
  lVar1 = 0;
  do {
    local_d0[lVar1 + 2] = *(float *)((long)&local_e0 + lVar1 * 4) + local_a8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_e0 = &evalCtx->color;
  local_d8 = 0x100000000;
  local_d0[0] = 2.8026e-45;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_e0 + lVar1 * 4)] = local_d0[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}